

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::
     IntegerHexCastLoop<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false,false,duckdb::HugeIntegerCastOperation>
               (char *buf,idx_t len,
               HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> *result,bool strict)

{
  char c;
  bool bVar1;
  ulong uVar2;
  HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> *in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint8_t digit;
  HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> *in_stack_00000008;
  char current_char;
  idx_t pos;
  idx_t start_pos;
  uint8_t local_3a;
  ulong local_38;
  
  local_38 = 1;
  while( true ) {
    if (in_RSI <= local_38) {
      bVar1 = HugeIntegerCastOperation::
              Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>
                        (in_stack_00000008);
      if (!bVar1) {
        return false;
      }
      return 1 < local_38;
    }
    c = StringUtil::CharacterToLower('\0');
    bVar1 = StringUtil::CharacterIsHex(c);
    if (!bVar1) break;
    if (c < 'a') {
      local_3a = UnsafeNumericCast<unsigned_char,int,void>(c + -0x30);
    }
    else {
      local_3a = UnsafeNumericCast<unsigned_char,int,void>(c + -0x57);
    }
    uVar2 = local_38 + 1;
    if (((uVar2 != in_RSI) && (*(char *)(in_RDI + uVar2) == '_')) &&
       ((uVar2 = local_38 + 2, uVar2 == in_RSI ||
        (bVar1 = StringUtil::CharacterIsHex(*(char *)(in_RDI + uVar2)), !bVar1)))) {
      return false;
    }
    local_38 = uVar2;
    bVar1 = HugeIntegerCastOperation::
            HandleHexDigit<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>
                      (in_RDX,local_3a);
    if (!bVar1) {
      return false;
    }
  }
  return false;
}

Assistant:

static bool IntegerHexCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	if (ALLOW_EXPONENT || NEGATIVE) {
		return false;
	}
	idx_t start_pos = 1;
	idx_t pos = start_pos;
	char current_char;
	while (pos < len) {
		current_char = StringUtil::CharacterToLower(buf[pos]);
		if (!StringUtil::CharacterIsHex(current_char)) {
			return false;
		}
		uint8_t digit;
		if (current_char >= 'a') {
			digit = UnsafeNumericCast<uint8_t>(current_char - 'a' + 10);
		} else {
			digit = UnsafeNumericCast<uint8_t>(current_char - '0');
		}
		pos++;

		if (pos != len && buf[pos] == '_') {
			// Skip one underscore if it is not the last character and followed by a hex
			pos++;
			if (pos == len || !StringUtil::CharacterIsHex(buf[pos])) {
				return false;
			}
		}

		if (!OP::template HandleHexDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}